

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O0

void __thiscall serialization::xml_oarchive::save(xml_oarchive *this,int v)

{
  xml_node<char> *this_00;
  char *pcVar1;
  char *value;
  char *end;
  char buffer [64];
  int v_local;
  xml_oarchive *this_local;
  
  buffer._60_4_ = v;
  pcVar1 = rapidjson::internal::i64toa((long)v,(char *)&end);
  this_00 = this->current_;
  value = rapidxml::memory_pool<char>::allocate_string
                    (&(this->document_).super_memory_pool<char>,(char *)&end,
                     (long)pcVar1 - (long)&end);
  rapidxml::xml_base<char>::value(&this_00->super_xml_base<char>,value,(long)pcVar1 - (long)&end);
  return;
}

Assistant:

void save(int v)
	{
		char buffer[64];
		const char* end = rapidjson::internal::i64toa(v, buffer);
        current_->value(document_.allocate_string(buffer, end - buffer), end - buffer);
	}